

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O1

void __thiscall ser::MetainfoSet::AddNode(MetainfoSet *this,JSONNode *node)

{
  uchar uVar1;
  internalJSONNode *piVar2;
  pointer pcVar3;
  bool bVar4;
  ostream *poVar5;
  SerializationException *this_00;
  double r;
  SerializationException exception;
  ostringstream ss;
  double local_1e8;
  undefined1 local_1e0 [8];
  _Alloc_hider local_1d8;
  undefined1 local_1d0 [24];
  json_string local_1b8;
  string local_198 [11];
  
  piVar2 = node->internal;
  uVar1 = piVar2->_type;
  if (uVar1 == '\x01') {
    local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
    pcVar3 = (piVar2->_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_198,pcVar3,pcVar3 + (piVar2->_name)._M_string_length);
    piVar2 = node->internal;
    internalJSONNode::Fetch(piVar2);
    pcVar3 = (piVar2->_string)._M_dataplus._M_p;
    local_1e0 = (undefined1  [8])local_1d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1e0,pcVar3,pcVar3 + (piVar2->_string)._M_string_length);
    AddMetainfo<std::__cxx11::string>
              (this,local_198,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
    if (local_1e0 != (undefined1  [8])local_1d0) {
      operator_delete((void *)local_1e0);
    }
  }
  else {
    if (uVar1 == '\x02') {
      local_1e8 = internalJSONNode::operator_cast_to_double(piVar2);
      if ((local_1e8 != (double)(int)local_1e8) || (NAN(local_1e8) || NAN((double)(int)local_1e8)))
      {
        local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
        pcVar3 = (node->internal->_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_198,pcVar3,pcVar3 + (node->internal->_name)._M_string_length);
        AddMetainfo<double>(this,local_198,&local_1e8);
      }
      else {
        local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
        pcVar3 = (node->internal->_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_198,pcVar3,pcVar3 + (node->internal->_name)._M_string_length);
        local_1e0._0_4_ = (int)local_1e8;
        AddMetainfo<int>(this,local_198,(int *)local_1e0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198[0]._M_dataplus._M_p == &local_198[0].field_2) {
        return;
      }
      goto LAB_0015f24e;
    }
    if (uVar1 != '\x03') {
      local_1d8._M_p = local_1d0 + 8;
      local_1e0 = (undefined1  [8])&PTR__SerializationException_0018e9e8;
      local_1d0._0_8_ = 0;
      local_1d0[8] = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Error: JSON node has wrong type and could not be parsed:\n",
                 0x39);
      JSONNode::write_formatted_abi_cxx11_(&local_1b8,node,0x800);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
      SerializationException::SerializationException(this_00,(SerializationException *)local_1e0);
      __cxa_throw(this_00,&SerializationException::typeinfo,
                  SerializationException::~SerializationException);
    }
    local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
    pcVar3 = (piVar2->_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_198,pcVar3,pcVar3 + (piVar2->_name)._M_string_length);
    bVar4 = internalJSONNode::operator_cast_to_bool(node->internal);
    local_1e0[0] = bVar4;
    AddMetainfo<bool>(this,local_198,(bool *)local_1e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p == &local_198[0].field_2) {
    return;
  }
LAB_0015f24e:
  operator_delete(local_198[0]._M_dataplus._M_p);
  return;
}

Assistant:

void MetainfoSet::AddNode(const JSONNode& node)
{
    JSON_NUMBER_TYPE r;
    switch (node.type())
    {
    case JSON_BOOL:
        return AddMetainfo(node.name(), node.as_bool());
    case JSON_STRING:
        return AddMetainfo(node.name(), node.as_string());
    case JSON_NUMBER:
        r = node.as_float();
        if (r == static_cast<JSON_NUMBER_TYPE>(static_cast<int>(r)))
            return AddMetainfo(node.name(), static_cast<int>(r));
        else
            return AddMetainfo(node.name(), r);
    default:
        break;
    }

    SerializationException exception;
    std::ostringstream ss;
    ss << "Error: JSON node has wrong type and could not be parsed:\n" << node.write_formatted() << "\n";
    exception.Init(ss.str());
    throw exception;
}